

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExpressionCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionCoverageBinInitializerSyntax,slang::syntax::ExpressionCoverageBinInitializerSyntax_const&>
          (BumpAllocator *this,ExpressionCoverageBinInitializerSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  undefined4 uVar4;
  ExpressionCoverageBinInitializerSyntax *pEVar5;
  
  pEVar5 = (ExpressionCoverageBinInitializerSyntax *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)&(args->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->expr).ptr;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind =
       (args->super_CoverageBinInitializerSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar5->super_CoverageBinInitializerSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar5->expr).ptr = pEVar3;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }